

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  int iVar3;
  xml_attribute_struct *pxVar4;
  char_t *__s2;
  bool bVar5;
  xml_node_struct *local_38;
  
  pxVar1 = this->_root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    return (xml_node)(xml_node_struct *)0x0;
  }
  pxVar2 = pxVar1->first_child;
  do {
    if (pxVar2 == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    bVar5 = true;
    local_38 = pxVar1;
    if ((pxVar2->name != (char *)0x0) && (iVar3 = strcmp(name_,pxVar2->name), iVar3 == 0)) {
      for (pxVar4 = pxVar2->first_attribute; bVar5 = pxVar4 == (xml_attribute_struct *)0x0,
          local_38 = pxVar1, !bVar5; pxVar4 = pxVar4->next_attribute) {
        if ((pxVar4->name != (char *)0x0) && (iVar3 = strcmp(attr_name,pxVar4->name), iVar3 == 0)) {
          __s2 = pxVar4->value;
          if (__s2 == (char_t *)0x0) {
            __s2 = "";
          }
          iVar3 = strcmp(attr_value,__s2);
          local_38 = pxVar2;
          if (iVar3 == 0) break;
        }
      }
    }
    if (!bVar5) {
      return (xml_node)local_38;
    }
    pxVar2 = pxVar2->next_sibling;
    pxVar1 = local_38;
  } while( true );
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
				{
					const char_t* aname = a->name;
					if (aname && impl::strequal(attr_name, aname))
					{
						const char_t* avalue = a->value;
						if (impl::strequal(attr_value, avalue ? avalue : PUGIXML_TEXT("")))
							return xml_node(i);
					}
				}
			}
		}

		return xml_node();
	}